

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O1

void vorbis_lpc_predict(float *coeff,float *prime,int m,float *data,long n)

{
  size_t sVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *__s;
  float fVar9;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = (long)m;
  lVar4 = -((local_38 + n) * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (float *)((long)&local_38 + lVar4);
  lVar8 = local_38;
  if (prime == (float *)0x0) {
    if (0 < m) {
      sVar1 = local_38 * 4;
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1d43c8;
      memset(__s,0,sVar1);
      lVar8 = local_38;
    }
  }
  else if (0 < m) {
    sVar1 = local_38 * 4;
    *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1d43ab;
    memcpy(__s,prime,sVar1);
    lVar8 = local_38;
  }
  if (0 < n) {
    lVar2 = 0;
    pfVar3 = __s;
    lVar4 = lVar8;
    do {
      fVar9 = 0.0;
      lVar6 = lVar2;
      pfVar5 = pfVar3;
      lVar7 = lVar8;
      if (0 < m) {
        do {
          fVar9 = fVar9 - *pfVar5 * coeff[lVar7 + -1];
          lVar7 = lVar7 + -1;
          lVar6 = lVar4;
          pfVar5 = pfVar5 + 1;
        } while (lVar7 != 0);
      }
      __s[lVar6] = fVar9;
      data[lVar2] = fVar9;
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
    } while (lVar2 != n);
  }
  return;
}

Assistant:

void vorbis_lpc_predict(float *coeff,float *prime,int m,
                     float *data,long n){

  /* in: coeff[0...m-1] LPC coefficients
         prime[0...m-1] initial values (allocated size of n+m-1)
    out: data[0...n-1] data samples */

  long i,j,o,p;
  float y;
  float *work=alloca(sizeof(*work)*(m+n));

  if(!prime)
    for(i=0;i<m;i++)
      work[i]=0.f;
  else
    for(i=0;i<m;i++)
      work[i]=prime[i];

  for(i=0;i<n;i++){
    y=0;
    o=i;
    p=m;
    for(j=0;j<m;j++)
      y-=work[o++]*coeff[--p];

    data[i]=work[o]=y;
  }
}